

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Ptr_t *
Acb_TransformPatchFunctions(Vec_Ptr_t *vSops,Vec_Wec_t *vSupps,Vec_Int_t **pvUsed,int nDivs)

{
  uint uVar1;
  int Entry;
  Vec_Int_t *pVVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Int_t *p;
  int *piVar6;
  Vec_Int_t *vMap;
  int *__ptr;
  void *__s;
  size_t sVar7;
  char *__dest;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong local_78;
  int *local_68;
  
  uVar1 = vSops->nSize;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  local_78 = 8;
  if (6 < uVar1 - 1) {
    local_78 = (ulong)uVar1;
  }
  pVVar4->nSize = 0;
  iVar3 = (int)local_78;
  pVVar4->nCap = iVar3;
  if (iVar3 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar3 << 3);
  }
  pVVar4->pArray = ppvVar5;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar6 = (int *)malloc(400);
  p->pArray = piVar6;
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < nDivs - 1U) {
    iVar3 = nDivs;
  }
  vMap->nCap = iVar3;
  if (iVar3 == 0) {
    vMap->pArray = (int *)0x0;
    vMap->nSize = nDivs;
    __ptr = (int *)malloc(0x10);
    piVar6 = __ptr + 1;
    *__ptr = 0;
    local_68 = (int *)0x0;
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = nDivs;
  }
  else {
    local_68 = (int *)malloc((long)iVar3 << 2);
    vMap->pArray = local_68;
    vMap->nSize = nDivs;
    if (local_68 != (int *)0x0) {
      memset(local_68,0xff,(long)nDivs * 4);
    }
    __ptr = (int *)malloc(0x10);
    piVar6 = __ptr + 1;
    *__ptr = iVar3;
    __s = malloc((long)iVar3 << 2);
    *(void **)(__ptr + 2) = __s;
    __ptr[1] = nDivs;
    if (__s != (void *)0x0) {
      memset(__s,0,(long)nDivs << 2);
    }
  }
  if (0 < vSupps->nSize) {
    lVar12 = 0;
    while (lVar12 < vSops->nSize) {
      pVVar2 = vSupps->pArray;
      pcVar8 = (char *)vSops->pArray[lVar12];
      if (pcVar8 == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar7 = strlen(pcVar8);
        __dest = (char *)malloc(sVar7 + 1);
        strcpy(__dest,pcVar8);
      }
      pcVar8 = strtok(__dest,"\n");
      if (pcVar8 != (char *)0x0) {
LAB_00376923:
        lVar9 = 0;
        do {
          if (pcVar8[lVar9] != '-') {
            if (pcVar8[lVar9] == ' ') goto LAB_0037696a;
            if (pVVar2[lVar12].nSize <= lVar9) goto LAB_00376bd0;
            iVar3 = pVVar2[lVar12].pArray[lVar9];
            if (((long)iVar3 < 0) || (*piVar6 <= iVar3)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(undefined4 *)(*(long *)(__ptr + 2) + (long)iVar3 * 4) = 1;
          }
          lVar9 = lVar9 + 1;
        } while( true );
      }
LAB_00376979:
      if (__dest != (char *)0x0) {
        free(__dest);
      }
      lVar12 = lVar12 + 1;
      uVar10 = (ulong)vSupps->nSize;
      if ((long)uVar10 <= lVar12) goto code_r0x0037699d;
    }
LAB_00376bef:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
LAB_00376a35:
  if ((long)*piVar6 < 1) {
    uVar10 = 0;
  }
  else {
    lVar12 = 0;
    uVar10 = 0;
    do {
      uVar10 = (ulong)(uint)((int)uVar10 + *(int *)(*(long *)(__ptr + 2) + lVar12 * 4));
      lVar12 = lVar12 + 1;
    } while (*piVar6 != lVar12);
  }
  printf("The number of used variables %d (out of %d).\n",uVar10);
  if (0 < vSupps->nSize) {
    lVar9 = 0;
    lVar12 = 0;
    do {
      if (vSops->nSize <= lVar12) goto LAB_00376bef;
      pcVar8 = Acb_RemapOneFunction
                         ((char *)vSops->pArray[lVar12],
                          (Vec_Int_t *)((long)&vSupps->pArray->nCap + lVar9),vMap,p->nSize);
      iVar3 = (int)local_78;
      if ((int)lVar12 == iVar3) {
        if (iVar3 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
          local_78 = 0x10;
        }
        else {
          local_78 = (ulong)(uint)(iVar3 * 2);
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(local_78 * 8);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,local_78 * 8);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar3 * 2;
        }
      }
      else {
        ppvVar5 = pVVar4->pArray;
      }
      lVar11 = lVar12 + 1;
      pVVar4->nSize = (int)lVar11;
      ppvVar5[lVar12] = pcVar8;
      lVar9 = lVar9 + 0x10;
      lVar12 = lVar11;
    } while (lVar11 < vSupps->nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  if (vMap->pArray != (int *)0x0) {
    free(vMap->pArray);
  }
  free(vMap);
  *pvUsed = p;
  return pVVar4;
LAB_0037696a:
  pcVar8 = strtok((char *)0x0,"\n");
  if (pcVar8 == (char *)0x0) goto LAB_00376979;
  goto LAB_00376923;
code_r0x0037699d:
  if (0 < vSupps->nSize) {
    lVar12 = 0;
    do {
      pVVar2 = vSupps->pArray;
      iVar3 = pVVar2[lVar12].nSize;
      if (0 < iVar3) {
        lVar9 = 0;
        do {
          Entry = pVVar2[lVar12].pArray[lVar9];
          lVar11 = (long)Entry;
          if ((lVar11 < 0) || (*piVar6 <= Entry)) goto LAB_00376bd0;
          if (*(int *)(*(long *)(__ptr + 2) + lVar11 * 4) != 0) {
            if (nDivs <= Entry) {
LAB_00376bd0:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (local_68[lVar11] < 0) {
              local_68[lVar11] = p->nSize;
              Vec_IntPush(p,Entry);
              iVar3 = pVVar2[lVar12].nSize;
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar3);
        uVar10 = (ulong)(uint)vSupps->nSize;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar10);
  }
  goto LAB_00376a35;
}

Assistant:

Vec_Ptr_t * Acb_TransformPatchFunctions( Vec_Ptr_t * vSops, Vec_Wec_t * vSupps, Vec_Int_t ** pvUsed, int nDivs )
{
    Vec_Ptr_t * vFuncs = Vec_PtrAlloc( Vec_PtrSize(vSops) );
    Vec_Int_t * vUsed = Vec_IntAlloc( 100 ); 
    Vec_Int_t * vMap = Vec_IntStartFull( nDivs );
    Vec_Int_t * vPres = Vec_IntStart( nDivs );
    Vec_Int_t * vLevel;
    int i, k, iVar;
    // check what divisors are used
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        char * pStrCopy = Abc_UtilStrsav( pSop );
        char * pToken = strtok( pStrCopy, "\n" ); 
        while ( pToken != NULL )
        {
            for ( k = 0; pToken[k] != ' '; k++ )
                if ( pToken[k] != '-' )
                    Vec_IntWriteEntry( vPres, Vec_IntEntry(vLevel, k), 1 );
            pToken = strtok( NULL, "\n" );
        }
        ABC_FREE( pStrCopy );
    }
    // create common order
    Vec_WecForEachLevel( vSupps, vLevel, i )
        Vec_IntForEachEntry( vLevel, iVar, k )
        {
            if ( !Vec_IntEntry(vPres, iVar) )
                continue;
            if ( Vec_IntEntry(vMap, iVar) >= 0 )
                continue;
            Vec_IntWriteEntry( vMap, iVar, Vec_IntSize(vUsed) );
            Vec_IntPush( vUsed, iVar );
        }
    printf( "The number of used variables %d (out of %d).\n", Vec_IntSum(vPres), Vec_IntSize(vPres) );
    // remap SOPs
    Vec_WecForEachLevel( vSupps, vLevel, i )
    {
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        pSop = Acb_RemapOneFunction( pSop, vLevel, vMap, Vec_IntSize(vUsed) );
        //printf( "Function %d\n%s", i, pSop );
        Vec_PtrPush( vFuncs, pSop );
    }
    Vec_IntFree( vPres );
    Vec_IntFree( vMap );
    *pvUsed = vUsed;
    return vFuncs;
}